

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O0

X509 * d2i_X509_AUX(X509 **a,uchar **pp,long length)

{
  bool bVar1;
  X509_CERT_AUX *pXVar2;
  int freeret;
  X509 *ret;
  uchar *q;
  long length_local;
  uchar **pp_local;
  X509 **a_local;
  
  ret = (X509 *)*pp;
  bVar1 = false;
  if ((a == (X509 **)0x0) || (*a == (X509 *)0x0)) {
    bVar1 = true;
  }
  q = (uchar *)length;
  length_local = (long)pp;
  pp_local = (uchar **)a;
  a_local = (X509 **)d2i_X509(a,(uchar **)&ret,length);
  if ((X509 *)a_local == (X509 *)0x0) {
    a_local = (X509 **)0x0;
  }
  else {
    q = q + -((long)ret - *(long *)length_local);
    if (((long)q < 1) ||
       (pXVar2 = d2i_X509_CERT_AUX((X509_CERT_AUX **)&((X509 *)a_local)->altname,(uchar **)&ret,
                                   (long)q), pXVar2 != (X509_CERT_AUX *)0x0)) {
      *(X509 **)length_local = ret;
    }
    else {
      if ((bVar1) && (X509_free((X509 *)a_local), pp_local != (uchar **)0x0)) {
        *pp_local = (uchar *)0x0;
      }
      a_local = (X509 **)0x0;
    }
  }
  return (X509 *)a_local;
}

Assistant:

X509 *d2i_X509_AUX(X509 **a, const unsigned char **pp, long length) {
  const unsigned char *q = *pp;
  X509 *ret;
  int freeret = 0;

  if (!a || *a == NULL) {
    freeret = 1;
  }
  ret = d2i_X509(a, &q, length);
  // If certificate unreadable then forget it
  if (!ret) {
    return NULL;
  }
  // update length
  length -= q - *pp;
  // Parse auxiliary information if there is any.
  if (length > 0 && !d2i_X509_CERT_AUX(&ret->aux, &q, length)) {
    goto err;
  }
  *pp = q;
  return ret;
err:
  if (freeret) {
    X509_free(ret);
    if (a) {
      *a = NULL;
    }
  }
  return NULL;
}